

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_delphi_generator.cc
# Opt level: O2

void __thiscall
t_delphi_generator::generate_delphi_clear_union_value
          (t_delphi_generator *this,ostream *out,string cls_prefix,string name,t_type *type,
          t_field *tfield,string fieldPrefix,bool is_xception_class,bool is_union,
          bool is_xception_factory,string xception_factory_name)

{
  t_type *ttype;
  int iVar1;
  ostream *poVar2;
  undefined7 in_register_00000089;
  t_field *tfield_00;
  string local_70;
  string local_50;
  
  tfield_00 = (t_field *)CONCAT71(in_register_00000089,is_union);
  ttype = tfield_00->type_;
  iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[0xc])(ttype);
  poVar2 = indent_impl(this,out);
  poVar2 = std::operator<<(poVar2,"if F__isset_");
  prop_name_abi_cxx11_(&local_70,this,tfield_00,cls_prefix._M_string_length._0_1_);
  poVar2 = std::operator<<(poVar2,(string *)&local_70);
  poVar2 = std::operator<<(poVar2," then begin");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  this->indent_impl_ = this->indent_impl_ + 1;
  poVar2 = indent_impl(this,out);
  poVar2 = std::operator<<(poVar2,"F__isset_");
  prop_name_abi_cxx11_(&local_70,this,tfield_00,cls_prefix._M_string_length._0_1_);
  poVar2 = std::operator<<(poVar2,(string *)&local_70);
  poVar2 = std::operator<<(poVar2," := False;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  poVar2 = indent_impl(this,out);
  poVar2 = std::operator<<(poVar2,(string *)cls_prefix._M_dataplus._M_p);
  prop_name_abi_cxx11_(&local_70,this,tfield_00,cls_prefix._M_string_length._0_1_);
  poVar2 = std::operator<<(poVar2,(string *)&local_70);
  poVar2 = std::operator<<(poVar2," := ");
  poVar2 = std::operator<<(poVar2,"Default( ");
  type_name_abi_cxx11_(&local_50,this,ttype,false,true,SUB41(iVar1,0),true);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  poVar2 = std::operator<<(poVar2,");");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  this->indent_impl_ = this->indent_impl_ + -1;
  poVar2 = indent_impl(this,out);
  poVar2 = std::operator<<(poVar2,"end;");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_delphi_generator::generate_delphi_clear_union_value(ostream& out,
                                                           std::string cls_prefix,
                                                           std::string name,
                                                           t_type* type,
                                                           t_field* tfield,
                                                           std::string fieldPrefix,
                                                           bool is_xception_class,
                                                           bool is_union,
                                                           bool is_xception_factory,
                                                           std::string xception_factory_name) {
  (void)cls_prefix;
  (void)name;
  (void)type;
  (void)is_union;
  (void)is_xception_factory;
  (void)xception_factory_name;

  t_type* ftype = tfield->get_type();
  bool is_xception = ftype->is_xception();

  indent_impl(out) << "if F__isset_" << prop_name(tfield, is_xception_class) << " then begin"
                   << endl;
  indent_up_impl();
  indent_impl(out) << "F__isset_" << prop_name(tfield, is_xception_class) << " := False;" << endl;
  indent_impl(out) << fieldPrefix << prop_name(tfield, is_xception_class) << " := "
                   << "Default( " << type_name(ftype, false, true, is_xception, true) << ");"
                   << endl;
  indent_down_impl();
  indent_impl(out) << "end;" << endl;
}